

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O3

int WebPWriteYUV(FILE *fout,WebPDecBuffer *buffer)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  uint8_t *__ptr;
  uint8_t *__ptr_00;
  uint8_t *__ptr_01;
  int iVar6;
  uint8_t *__ptr_02;
  size_t __size;
  bool bVar7;
  
  if (buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) {
    __ptr_02 = (buffer->u).RGBA.rgba;
    __ptr = (buffer->u).YUVA.u;
    __ptr_01 = (buffer->u).YUVA.v;
    if (__ptr_01 != (uint8_t *)0x0 && (__ptr != (uint8_t *)0x0 && __ptr_02 != (uint8_t *)0x0)) {
      iVar1 = buffer->height;
      if (iVar1 < 1) {
        bVar7 = true;
      }
      else {
        iVar2 = buffer->width;
        __ptr_00 = (buffer->u).YUVA.a;
        iVar4 = (iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1;
        iVar6 = 1;
        do {
          sVar5 = fwrite(__ptr_02,(long)iVar2,1,(FILE *)fout);
          bVar7 = sVar5 == 1;
          if (!bVar7) break;
          __ptr_02 = __ptr_02 + (buffer->u).YUVA.y_stride;
          bVar3 = iVar6 < iVar1;
          iVar6 = iVar6 + 1;
        } while (bVar3);
        __size = (size_t)((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1);
        if (0 < iVar1 && sVar5 == 1) {
          iVar6 = 1;
          do {
            sVar5 = fwrite(__ptr,__size,1,(FILE *)fout);
            bVar7 = sVar5 == 1;
            if (!bVar7) break;
            __ptr = __ptr + (buffer->u).YUVA.u_stride;
            bVar3 = iVar6 < iVar4;
            iVar6 = iVar6 + 1;
          } while (bVar3);
        }
        if (bVar7 == true && 0 < iVar1) {
          iVar6 = 1;
          do {
            sVar5 = fwrite(__ptr_01,__size,1,(FILE *)fout);
            bVar7 = sVar5 == 1;
            if (!bVar7) break;
            __ptr_01 = __ptr_01 + (buffer->u).YUVA.v_stride;
            bVar3 = iVar6 < iVar4;
            iVar6 = iVar6 + 1;
          } while (bVar3);
        }
        if ((__ptr_00 != (uint8_t *)0x0 && 0 < iVar1) && bVar7 == true) {
          iVar6 = 1;
          do {
            sVar5 = fwrite(__ptr_00,(long)iVar2,1,(FILE *)fout);
            bVar7 = sVar5 == 1;
            if (!bVar7) break;
            __ptr_00 = __ptr_00 + (buffer->u).YUVA.a_stride;
            bVar3 = iVar6 < iVar1;
            iVar6 = iVar6 + 1;
          } while (bVar3);
        }
      }
      goto LAB_00104a46;
    }
  }
  bVar7 = false;
LAB_00104a46:
  return (int)bVar7;
}

Assistant:

int WebPWriteYUV(FILE* fout, const WebPDecBuffer* const buffer) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const int width = buffer->width;
    const int height = buffer->height;
    const WebPYUVABuffer* const yuv = &buffer->u.YUVA;
    const uint8_t* src_y = yuv->y;
    const uint8_t* src_u = yuv->u;
    const uint8_t* src_v = yuv->v;
    const uint8_t* src_a = yuv->a;
    const int uv_width = (width + 1) / 2;
    const int uv_height = (height + 1) / 2;
    const int a_height = (src_a != NULL) ? height : 0;
    int ok = 1;
    int y;

    if (src_y == NULL || src_u == NULL || src_v == NULL) return 0;

    for (y = 0; ok && y < height; ++y) {
      ok &= (fwrite(src_y, width, 1, fout) == 1);
      src_y += yuv->y_stride;
    }
    for (y = 0; ok && y < uv_height; ++y) {
      ok &= (fwrite(src_u, uv_width, 1, fout) == 1);
      src_u += yuv->u_stride;
    }
    for (y = 0; ok && y < uv_height; ++y) {
      ok &= (fwrite(src_v, uv_width, 1, fout) == 1);
      src_v += yuv->v_stride;
    }
    for (y = 0; ok && y < a_height; ++y) {
      ok &= (fwrite(src_a, width, 1, fout) == 1);
      src_a += yuv->a_stride;
    }
    return ok;
  }
}